

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall slang::parsing::Parser::isVariableDeclaration(Parser *this)

{
  bool bVar1;
  ParserBase *in_RDI;
  Token TVar2;
  TokenKind next_1;
  Token next;
  TokenKind kind;
  uint32_t index;
  bool local_e3;
  bool local_e2;
  bool local_e1;
  undefined8 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff30 [16];
  undefined1 in_stack_ffffffffffffff40 [16];
  undefined1 in_stack_ffffffffffffff50 [16];
  TokenKind local_a0;
  undefined1 in_stack_ffffffffffffff70 [16];
  TokenKind local_78;
  TokenKind local_68;
  TokenKind local_58;
  TokenKind local_48;
  TokenKind local_38;
  TokenKind local_28;
  bool local_1;
  
  bVar1 = scanAttributes(in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._0_8_);
  if (bVar1) {
    TVar2 = ParserBase::peek(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    local_28 = TVar2.kind;
    switch(local_28) {
    case AutomaticKeyword:
    case CHandleKeyword:
    case EnumKeyword:
    case EventKeyword:
    case LetKeyword:
    case LocalParamKeyword:
    case NetTypeKeyword:
    case ParameterKeyword:
    case StructKeyword:
    case TypedefKeyword:
    case UnionKeyword:
    case VarKeyword:
      local_1 = true;
      break;
    default:
      bVar1 = scanQualifiedName(in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_,
                                local_a0._15_1_);
      if (bVar1) {
        bVar1 = scanDimensionList(in_stack_ffffffffffffff30._8_8_,in_stack_ffffffffffffff30._0_8_);
        if (bVar1) {
          TVar2 = ParserBase::peek(in_RDI,0);
          local_e3 = false;
          if (TVar2.kind == Identifier) {
            TVar2 = ParserBase::peek(in_RDI,0);
            local_e3 = TVar2.kind != OpenParenthesis;
          }
          local_1 = local_e3;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
      break;
    case BitKeyword:
    case ByteKeyword:
    case ConstKeyword:
    case IntKeyword:
    case IntegerKeyword:
    case LogicKeyword:
    case LongIntKeyword:
    case RealKeyword:
    case RealTimeKeyword:
    case RegKeyword:
    case ShortIntKeyword:
    case ShortRealKeyword:
    case StringKeyword:
    case TimeKeyword:
      TVar2 = ParserBase::peek(in_RDI,0);
      local_e2 = TVar2.kind != Apostrophe && TVar2.kind != ApostropheOpenBrace;
      local_1 = local_e2;
      break;
    case ImportKeyword:
      TVar2 = ParserBase::peek(in_RDI,0);
      local_48 = TVar2.kind;
      local_1 = local_48 != StringLiteral;
      break;
    case StaticKeyword:
      TVar2 = ParserBase::peek(in_RDI,0);
      local_38 = TVar2.kind;
      local_e1 = false;
      if ((local_38 != FunctionKeyword) && (local_e1 = false, local_38 != TaskKeyword)) {
        local_e1 = local_38 != ConstraintKeyword;
      }
      local_1 = local_e1;
      break;
    case TypeKeyword:
      TVar2 = ParserBase::peek(in_RDI,0);
      local_a0 = TVar2.kind;
      if (local_a0 == OpenParenthesis) {
        bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                          (in_stack_ffffffffffffff40._8_8_,in_stack_ffffffffffffff40._0_8_,
                           in_stack_ffffffffffffff30._14_2_,in_stack_ffffffffffffff30._12_2_);
        if (bVar1) {
          TVar2 = ParserBase::peek(in_RDI,0);
          local_1 = TVar2.kind == Identifier;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
      break;
    case VirtualKeyword:
      TVar2 = ParserBase::peek(in_RDI,0);
      local_58 = TVar2.kind;
      if (local_58 == InterfaceKeyword) {
        local_1 = true;
      }
      else {
        bVar1 = scanQualifiedName(in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_,
                                  local_a0._15_1_);
        if (bVar1) {
          TVar2 = ParserBase::peek(in_RDI,0);
          local_68 = TVar2.kind;
          if (local_68 == Dot) {
            local_1 = true;
          }
          else {
            TVar2 = ParserBase::peek(in_RDI,0);
            local_78 = TVar2.kind;
            local_1 = local_78 == Identifier;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::isVariableDeclaration() {
    uint32_t index = 0;
    if (!scanAttributes(index))
        return false;

    // decide whether a statement is a declaration or the start of an expression
    auto kind = peek(index).kind;
    switch (kind) {
        // some tokens unambiguously start a declaration
        case TokenKind::VarKeyword:
        case TokenKind::AutomaticKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::TypedefKeyword:
        case TokenKind::NetTypeKeyword:
        case TokenKind::LocalParamKeyword:
        case TokenKind::ParameterKeyword:
        case TokenKind::LetKeyword:
            return true;

        // Static keyword *should* always be a variable, but it could accidentally
        // be an attempt at an out-of-block function declaration, or it could legitimately
        // be an out-of-block constraint declaration.
        case TokenKind::StaticKeyword: {
            auto next = peek(index + 1);
            return next.kind != TokenKind::FunctionKeyword && next.kind != TokenKind::TaskKeyword &&
                   next.kind != TokenKind::ConstraintKeyword;
        }

        // either an import of a package or a DPI import
        case TokenKind::ImportKeyword:
            return peek(index + 1).kind != TokenKind::StringLiteral;

        // this could be a virtual interface, a virtual class declaration, or a virtual function
        case TokenKind::VirtualKeyword:
            if (peek(++index).kind == TokenKind::InterfaceKeyword)
                return true;
            if (!scanQualifiedName(index, /* allowNew */ false))
                return false;
            if (peek(index).kind == TokenKind::Dot)
                return true;
            return peek(index).kind == TokenKind::Identifier;

        // some cases might be a cast expression
        case TokenKind::StringKeyword:
        case TokenKind::ConstKeyword:
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword: {
            auto next = peek(++index).kind;
            return next != TokenKind::Apostrophe && next != TokenKind::ApostropheOpenBrace;
        }

        // if this is the type operator it's technically not allowed to be a variable
        // declaration without a "var" prefix, but we'll try to allow it anyway and
        // diagnose it later with a better error message.
        case TokenKind::TypeKeyword: {
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
            return peek(index).kind == TokenKind::Identifier;
        }

        default:
            break;
    }

    if (!scanQualifiedName(index, /* allowNew */ false))
        return false;

    // might be a list of dimensions here
    if (!scanDimensionList(index))
        return false;

    // next token is the decider; declarations must have an identifier here
    // and there can't be an open parenthesis right after it.
    return peek(index).kind == TokenKind::Identifier &&
           peek(index + 1).kind != TokenKind::OpenParenthesis;
}